

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O0

void * subcanvas_new(t_symbol *s)

{
  int iVar1;
  _glist *x_00;
  _glist *gl;
  t_atom *argv_00;
  t_symbol *ptVar2;
  t_symbol *ptVar3;
  t_object *ptVar4;
  t_float tVar5;
  t_float tVar6;
  t_gobj *local_b8;
  t_gobj *outobj;
  int local_a8;
  int outno;
  int index1;
  int index2;
  t_symbol *sob;
  int argc;
  t_atom *argv;
  _glist *z;
  _glist *x;
  t_atom a [6];
  t_symbol *local_10;
  t_symbol *s_local;
  
  x_00 = canvas_getcurrent();
  local_10 = s;
  if (*s->s_name == '\0') {
    local_10 = gensym("/SUBPATCH/");
  }
  x._0_4_ = 1;
  a[0].a_type = A_NULL;
  a[0].a_w.w_float = 1.4013e-45;
  a[1].a_type = 0x42480000;
  a[1].a_w.w_float = 1.4013e-45;
  a[2].a_type = 0x43e10000;
  a[2].a_w.w_float = 1.4013e-45;
  a[3].a_type = 0x43960000;
  a[3].a_w.w_float = 2.8026e-45;
  a[4]._0_8_ = local_10;
  a[4].a_w.w_float = 1.4013e-45;
  a[5].a_type = 0x3f800000;
  gl = canvas_new((void *)0x0,(t_symbol *)0x0,6,(t_atom *)&x);
  if (((x_00 != (_glist *)0x0) && (x_00->gl_editor != (t_editor *)0x0)) &&
     (x_00->gl_editor->e_connectbuf != (_binbuf *)0x0)) {
    argv_00 = binbuf_getvec(x_00->gl_editor->e_connectbuf);
    iVar1 = binbuf_getnatom(x_00->gl_editor->e_connectbuf);
    _index1 = (t_symbol *)0x0;
    if (iVar1 == 7) {
      ptVar2 = atom_getsymbolarg(0,7,argv_00);
      ptVar3 = gensym("#X");
      if (ptVar2 == ptVar3) {
        ptVar2 = atom_getsymbolarg(1,7,argv_00);
        ptVar3 = gensym("connect");
        if (ptVar2 == ptVar3) {
          iVar1 = canvas_getindex(x_00,(t_gobj *)gl);
          tVar5 = atom_getfloat(argv_00 + 5);
          if (((int)tVar5 == 0) && (tVar5 = atom_getfloat(argv_00 + 4), (int)tVar5 == iVar1)) {
            tVar5 = atom_getfloat(argv_00 + 2);
            tVar6 = atom_getfloat(argv_00 + 3);
            local_a8 = (int)tVar5;
            for (local_b8 = x_00->gl_list; 0 < local_a8 && local_b8 != (t_gobj *)0x0;
                local_b8 = local_b8->g_next) {
              local_a8 = local_a8 + -1;
            }
            if ((local_b8 != (t_gobj *)0x0) &&
               (ptVar4 = pd_checkobject(&local_b8->g_pd), ptVar4 != (t_object *)0x0)) {
              ptVar4 = pd_checkobject(&local_b8->g_pd);
              iVar1 = obj_issignaloutlet(ptVar4,(int)tVar6);
              if (iVar1 == 0) {
                _index1 = gensym("inlet");
              }
              else {
                _index1 = gensym("inlet~");
              }
            }
          }
        }
      }
    }
    if (_index1 != (t_symbol *)0x0) {
      x._0_4_ = 1;
      a[0].a_type = 0x42140000;
      a[0].a_w.w_float = 1.4013e-45;
      a[1].a_type = 0x42140000;
      a[1].a_w.w_float = 2.8026e-45;
      a[2]._0_8_ = _index1;
      ptVar2 = gensym("obj");
      canvas_obj(gl,ptVar2,3,(t_atom *)&x);
      canvas_create_editor(gl);
      glist_noselect(gl);
      glist_select(gl,gl->gl_list);
    }
  }
  gl->gl_owner = x_00;
  canvas_pop(gl,1.0);
  return gl;
}

Assistant:

static void *subcanvas_new(t_symbol *s)
{
    t_atom a[6];
    t_canvas *x, *z = canvas_getcurrent();

    if (!*s->s_name) s = gensym("/SUBPATCH/");
    SETFLOAT(a+0, GLIST_DEFCANVASXLOC);
    SETFLOAT(a+1, GLIST_DEFCANVASYLOC);
    SETFLOAT(a+2, GLIST_DEFCANVASWIDTH);
    SETFLOAT(a+3, GLIST_DEFCANVASHEIGHT);
    SETSYMBOL(a+4, s);
    SETFLOAT(a+5, 1);
    x = canvas_new(0, 0, 6, a);

        /* check if subpatch is supposed to be connected (on the 1st inlet) */
    if(z && z->gl_editor && z->gl_editor->e_connectbuf)
    {
        t_atom*argv = binbuf_getvec(z->gl_editor->e_connectbuf);
        int argc = binbuf_getnatom(z->gl_editor->e_connectbuf);
        t_symbol *sob = 0;
        if ((argc == 7)
            && atom_getsymbolarg(0, argc, argv) == gensym("#X")
            && atom_getsymbolarg(1, argc, argv) == gensym("connect"))
        {
            int index2 = canvas_getindex(z, &x->gl_gobj);
            if (((int)atom_getfloat(argv+5) == 0)
                && (int)atom_getfloat(argv+4) == index2)
                {
                    int index1 = (int)atom_getfloat(argv+2);
                    int outno = (int)atom_getfloat(argv+3);
                    t_gobj*outobj=z->gl_list;
                        /* get handle to object */
                    while(index1-->0 && outobj)
                        outobj=outobj->g_next;
                    if(outobj && pd_checkobject(&outobj->g_pd))
                    {
                        if (obj_issignaloutlet(pd_checkobject(&outobj->g_pd), outno))
                            sob = gensym("inlet~");
                        else
                            sob = gensym("inlet");
                    }
                }
        }
        if(sob)
        {
                /* JMZ: weirdo hardcoded numbers, taken from
                 * glist_getnextxy(): 40
                 * and canvas_howputnew(): -3
                 */
            SETFLOAT(a+0, 37);
            SETFLOAT(a+1, 37);
            SETSYMBOL(a+2, sob);
            canvas_obj(x, gensym("obj"), 3, a);

                /* select the newly created inlet to continue autopatching */
            canvas_create_editor(x);
            glist_noselect(x);
            glist_select(x, x->gl_list);
        }
    }
    x->gl_owner = z;
    canvas_pop(x, 1);
    return (x);
}